

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O1

UBool icu_63::comparePartialLocationKey(UHashTok key1,UHashTok key2)

{
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (((key2.pointer != (void *)0x0 && key1.pointer != (void *)0x0) &&
      (*key1.pointer == *key2.pointer)) &&
     (*(long *)((long)key1.pointer + 8) == *(long *)((long)key2.pointer + 8))) {
    return *(char *)((long)key1.pointer + 0x10) == *(char *)((long)key2.pointer + 0x10);
  }
  return '\0';
}

Assistant:

static UBool U_CALLCONV
comparePartialLocationKey(const UHashTok key1, const UHashTok key2) {
    PartialLocationKey *p1 = (PartialLocationKey *)key1.pointer;
    PartialLocationKey *p2 = (PartialLocationKey *)key2.pointer;

    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    // We just check identity of tzID/mzID
    return (p1->tzID == p2->tzID && p1->mzID == p2->mzID && p1->isLong == p2->isLong);
}